

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O2

array_n<float,_1,_std::allocator<float>_> * __thiscall
sisl::array_n<float,_1,_std::allocator<float>_>::operator=
          (array_n<float,_1,_std::allocator<float>_> *this,
          array_n<float,_1,_std::allocator<float>_> *obj)

{
  uint uVar1;
  float *pfVar2;
  pointer pfVar3;
  pointer pfVar4;
  array_n<float,_1,_std::allocator<float>_> local_30;
  
  array_n(&local_30,obj);
  uVar1 = this->_dims[0];
  this->_dims[0] = local_30._dims[0];
  pfVar3 = this->first;
  pfVar4 = this->last;
  this->first = local_30.first;
  this->last = local_30.last;
  pfVar2 = this->_array;
  this->_array = local_30._array;
  local_30._array = pfVar2;
  local_30._dims[0] = uVar1;
  local_30.first = pfVar3;
  local_30.last = pfVar4;
  ~array_n(&local_30);
  return this;
}

Assistant:

array_n &operator=(const array_n &obj){
            array_n copy(obj);

            for(int i = 0; i < N; i++) {
                std::swap(_dims[i], copy._dims[i]);
            }
            std::swap(first, copy.first);
            std::swap(last, copy.last);
            std::swap(_array, copy._array);

            return *this;
        }